

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O0

void * bget(kmp_info_t *th,bufsize requested_size)

{
  int iVar1;
  thr_data_t *requested_size_00;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  size_t *psVar6;
  void *pvVar7;
  kmp_info_t *in_RSI;
  kmp_info_t *in_RDI;
  bool bVar8;
  void *newpool;
  bdhead_t *bdh;
  bhead_t *ba_1;
  bhead_t *bn;
  bhead_t *ba;
  int bin;
  bfhead_t *best;
  int use_blink;
  int compactseq;
  void *buf;
  bfhead_t *b;
  bufsize size;
  thr_data_t *thr;
  bfhead_t *in_stack_ffffffffffffff68;
  kmp_info_t *in_stack_ffffffffffffff70;
  kmp_info_t *local_88;
  kmp_info_t *in_stack_ffffffffffffff80;
  kmp_info_t *in_stack_ffffffffffffff90;
  int local_4c;
  kmp_info_t *local_48;
  int local_3c;
  kmp_info_t *local_30;
  kmp_info_t *local_28;
  kmp_info_t *th_00;
  
  local_28 = in_RSI;
  requested_size_00 = get_thr_data(in_RDI);
  local_3c = 0;
  if (((long)local_28 < 0) || ((char *)0x7ffffffffffffff8 < local_28->th_pad + 0x20)) {
    return (void *)0x0;
  }
  th_00 = local_28;
  __kmp_bget_dequeue(in_stack_ffffffffffffff80);
  if ((long)local_28 < 0x10) {
    local_28 = (kmp_info_t *)0x10;
  }
  uVar2 = (ulong)(local_28->th_pad + 7) & 0xfffffffffffffff8;
  sVar3 = uVar2 + 0x20;
  bVar8 = requested_size_00->mode != bget_mode_lifo;
  do {
    for (local_4c = bget_get_bin(sVar3); local_4c < 0x14; local_4c = local_4c + 1) {
      if (bVar8) {
        in_stack_ffffffffffffff80 = (kmp_info_t *)requested_size_00->freelist[local_4c].ql.flink;
      }
      else {
        in_stack_ffffffffffffff80 = (kmp_info_t *)requested_size_00->freelist[local_4c].ql.blink;
      }
      local_30 = in_stack_ffffffffffffff80;
      if (requested_size_00->mode == bget_mode_best) {
        local_48 = (kmp_info_t *)(requested_size_00->freelist + local_4c);
        while (local_30 != (kmp_info_t *)(requested_size_00->freelist + local_4c)) {
          if (((long)sVar3 <= *(long *)(local_30->th_pad + 0x10)) &&
             ((local_48 == (kmp_info_t *)(requested_size_00->freelist + local_4c) ||
              (*(long *)(local_30->th_pad + 0x10) < *(long *)(local_48->th_pad + 0x10))))) {
            local_48 = local_30;
          }
          if (bVar8) {
            local_88 = (kmp_info_t *)((qlinks_t *)(local_30->th_pad + 0x20))->flink;
          }
          else {
            local_88 = *(kmp_info_t **)(local_30->th_pad + 0x28);
          }
          local_30 = local_88;
        }
        local_30 = local_48;
      }
      while (local_30 != (kmp_info_t *)(requested_size_00->freelist + local_4c)) {
        if ((long)sVar3 <= *(long *)(local_30->th_pad + 0x10)) {
          if (0x30 < (long)(*(long *)(local_30->th_pad + 0x10) - sVar3)) {
            pcVar4 = local_30->th_pad + (*(long *)(local_30->th_pad + 0x10) - sVar3);
            *(size_t *)(local_30->th_pad + 0x10) = *(long *)(local_30->th_pad + 0x10) - sVar3;
            *(undefined8 *)(pcVar4 + 8) = *(undefined8 *)(local_30->th_pad + 0x10);
            *(size_t *)(pcVar4 + 0x10) = -sVar3;
            *(kmp_info_t **)pcVar4 = in_RDI;
            pcVar5 = pcVar4 + uVar2 + 0x28;
            pcVar5[0] = '\0';
            pcVar5[1] = '\0';
            pcVar5[2] = '\0';
            pcVar5[3] = '\0';
            pcVar5[4] = '\0';
            pcVar5[5] = '\0';
            pcVar5[6] = '\0';
            pcVar5[7] = '\0';
            __kmp_bget_remove_from_freelist((bfhead_t *)&local_30->th);
            __kmp_bget_insert_into_freelist
                      ((thr_data_t *)&in_stack_ffffffffffffff70->th,in_stack_ffffffffffffff68);
            requested_size_00->totalloc = sVar3 + requested_size_00->totalloc;
            requested_size_00->numget = requested_size_00->numget + 1;
            return pcVar4 + 0x20;
          }
          pcVar5 = local_30->th_pad + *(long *)(local_30->th_pad + 0x10);
          __kmp_bget_remove_from_freelist((bfhead_t *)&local_30->th);
          requested_size_00->totalloc =
               *(long *)(local_30->th_pad + 0x10) + requested_size_00->totalloc;
          requested_size_00->numget = requested_size_00->numget + 1;
          *(long *)(local_30->th_pad + 0x10) = -*(long *)(local_30->th_pad + 0x10);
          *(kmp_info_t **)pcVar5 = in_RDI;
          pcVar5[8] = '\0';
          pcVar5[9] = '\0';
          pcVar5[10] = '\0';
          pcVar5[0xb] = '\0';
          pcVar5[0xc] = '\0';
          pcVar5[0xd] = '\0';
          pcVar5[0xe] = '\0';
          pcVar5[0xf] = '\0';
          return (qlinks_t *)(local_30->th_pad + 0x20);
        }
        if (bVar8) {
          in_stack_ffffffffffffff70 = (kmp_info_t *)((qlinks_t *)(local_30->th_pad + 0x20))->flink;
          local_30 = in_stack_ffffffffffffff70;
        }
        else {
          in_stack_ffffffffffffff70 = *(kmp_info_t **)(local_30->th_pad + 0x28);
          local_30 = in_stack_ffffffffffffff70;
        }
      }
    }
    if (requested_size_00->compfcn == (bget_compact_t)0x0) break;
    local_3c = local_3c + 1;
    iVar1 = (*requested_size_00->compfcn)(sVar3,local_3c);
  } while (iVar1 != 0);
  if (requested_size_00->acqfcn != (bget_acquire_t)0x0) {
    if (requested_size_00->exp_incr + -0x20 < (long)sVar3) {
      sVar3 = uVar2 + 0x28;
      psVar6 = (size_t *)(*requested_size_00->acqfcn)(sVar3);
      if (psVar6 != (size_t *)0x0) {
        psVar6[3] = 0;
        psVar6[1] = (size_t)in_RDI;
        psVar6[2] = 0;
        *psVar6 = sVar3;
        requested_size_00->totalloc = sVar3 + requested_size_00->totalloc;
        requested_size_00->numget = requested_size_00->numget + 1;
        requested_size_00->numdget = requested_size_00->numdget + 1;
        return psVar6 + 5;
      }
    }
    else {
      pvVar7 = (*requested_size_00->acqfcn)(requested_size_00->exp_incr);
      if (pvVar7 != (void *)0x0) {
        bpool(in_stack_ffffffffffffff90,pvVar7,(bufsize)in_stack_ffffffffffffff80);
        pvVar7 = bget(th_00,(bufsize)requested_size_00);
        return pvVar7;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

static void *
bget(  kmp_info_t *th, bufsize requested_size )
{
    thr_data_t *thr = get_thr_data( th );
    bufsize size = requested_size;
    bfhead_t *b;
    void *buf;
    int compactseq = 0;
    int use_blink = 0;
/* For BestFit */
    bfhead_t *best;

    if ( size < 0 || size + sizeof( bhead_t ) > MaxSize ) {
        return NULL;
    }; // if

    __kmp_bget_dequeue( th );         /* Release any queued buffers */

    if (size < (bufsize)SizeQ) {      /* Need at least room for the */
        size = SizeQ;                 /*    queue links.  */
    }
    #if defined( SizeQuant ) && ( SizeQuant > 1 )
        size = (size + (SizeQuant - 1)) & (~(SizeQuant - 1));
    #endif

    size += sizeof(bhead_t);     /* Add overhead in allocated buffer
                                         to size required. */
    KMP_DEBUG_ASSERT( size >= 0 );
    KMP_DEBUG_ASSERT( size % SizeQuant == 0 );

    use_blink = ( thr->mode == bget_mode_lifo );

    /* If a compact function was provided in the call to bectl(), wrap
       a loop around the allocation process  to  allow  compaction  to
       intervene in case we don't find a suitable buffer in the chain. */

    for (;;) {
        int bin;

        for (bin = bget_get_bin( size ); bin < MAX_BGET_BINS; ++bin) {
            /* Link to next buffer */
            b = ( use_blink ? thr->freelist[ bin ].ql.blink : thr->freelist[ bin ].ql.flink );

            if (thr->mode == bget_mode_best) {
                best = &thr->freelist[ bin ];

                /* Scan the free list searching for the first buffer big enough
                   to hold the requested size buffer. */

                while (b != &thr->freelist[ bin ]) {
                    if (b->bh.bb.bsize >= (bufsize) size) {
                        if ((best == &thr->freelist[ bin ]) || (b->bh.bb.bsize < best->bh.bb.bsize)) {
                            best = b;
                        }
                    }

                    /* Link to next buffer */
                    b = ( use_blink ? b->ql.blink : b->ql.flink );
                }
                b = best;
            }

            while (b != &thr->freelist[ bin ]) {
                if ((bufsize) b->bh.bb.bsize >= (bufsize) size) {

                    /* Buffer  is big enough to satisfy  the request.  Allocate it
                       to the caller.  We must decide whether the buffer is  large
                       enough  to  split  into  the part given to the caller and a
                       free buffer that remains on the free list, or  whether  the
                       entire  buffer  should  be  removed  from the free list and
                       given to the caller in its entirety.   We  only  split  the
                       buffer if enough room remains for a header plus the minimum
                       quantum of allocation. */

                    if ((b->bh.bb.bsize - (bufsize) size) > (bufsize)(SizeQ + (sizeof(bhead_t)))) {
                        bhead_t *ba, *bn;

                        ba = BH(((char *) b) + (b->bh.bb.bsize - (bufsize) size));
                        bn = BH(((char *) ba) + size);

                        KMP_DEBUG_ASSERT(bn->bb.prevfree == b->bh.bb.bsize);

                        /* Subtract size from length of free block. */
                        b->bh.bb.bsize -= (bufsize) size;

                        /* Link allocated buffer to the previous free buffer. */
                        ba->bb.prevfree = b->bh.bb.bsize;

                        /* Plug negative size into user buffer. */
                        ba->bb.bsize = -size;

                        /* Mark this buffer as owned by this thread. */
                        TCW_PTR(ba->bb.bthr, th);   // not an allocated address (do not mark it)
                        /* Mark buffer after this one not preceded by free block. */
                        bn->bb.prevfree = 0;

                        /* unlink the buffer from the old freelist, and reinsert it into the new freelist */
                        __kmp_bget_remove_from_freelist( b );
                        __kmp_bget_insert_into_freelist( thr, b );
#if BufStats
                        thr->totalloc += (size_t) size;
                        thr->numget++;        /* Increment number of bget() calls */
#endif
                        buf = (void *) ((((char *) ba) + sizeof(bhead_t)));
                        KMP_DEBUG_ASSERT( ((size_t)buf) % SizeQuant == 0 );
                        return buf;
                    } else {
                        bhead_t *ba;

                        ba = BH(((char *) b) + b->bh.bb.bsize);

                        KMP_DEBUG_ASSERT(ba->bb.prevfree == b->bh.bb.bsize);

                        /* The buffer isn't big enough to split.  Give  the  whole
                           shebang to the caller and remove it from the free list. */

                       __kmp_bget_remove_from_freelist( b );
#if BufStats
                        thr->totalloc += (size_t) b->bh.bb.bsize;
                        thr->numget++;        /* Increment number of bget() calls */
#endif
                        /* Negate size to mark buffer allocated. */
                        b->bh.bb.bsize = -(b->bh.bb.bsize);

                        /* Mark this buffer as owned by this thread. */
                        TCW_PTR(ba->bb.bthr, th);   // not an allocated address (do not mark it)
                        /* Zero the back pointer in the next buffer in memory
                           to indicate that this buffer is allocated. */
                        ba->bb.prevfree = 0;

                        /* Give user buffer starting at queue links. */
                        buf =  (void *) &(b->ql);
                        KMP_DEBUG_ASSERT( ((size_t)buf) % SizeQuant == 0 );
                        return buf;
                    }
                }

                /* Link to next buffer */
                b = ( use_blink ? b->ql.blink : b->ql.flink );
            }
        }

        /* We failed to find a buffer.  If there's a compact  function
           defined,  notify  it  of the size requested.  If it returns
           TRUE, try the allocation again. */

        if ((thr->compfcn == 0) || (!(*thr->compfcn)(size, ++compactseq))) {
            break;
        }
    }

    /* No buffer available with requested size free. */

    /* Don't give up yet -- look in the reserve supply. */

    if (thr->acqfcn != 0) {
        if (size > (bufsize) (thr->exp_incr - sizeof(bhead_t))) {

            /* Request  is  too  large  to  fit in a single expansion
               block.  Try to satisy it by a direct buffer acquisition. */

            bdhead_t *bdh;

            size += sizeof(bdhead_t) - sizeof(bhead_t);

            KE_TRACE( 10, ("%%%%%% MALLOC( %d )\n", (int) size ) );

            /* richryan */
            bdh = BDH((*thr->acqfcn)((bufsize) size));
            if (bdh != NULL) {

                /*  Mark the buffer special by setting the size field
                    of its header to zero.  */
                bdh->bh.bb.bsize = 0;

                /* Mark this buffer as owned by this thread. */
                TCW_PTR(bdh->bh.bb.bthr, th);  // don't mark buffer as allocated,
                                               // because direct buffer never goes to free list
                bdh->bh.bb.prevfree = 0;
                bdh->tsize = size;
#if BufStats
                thr->totalloc += (size_t) size;
                thr->numget++;        /* Increment number of bget() calls */
                thr->numdget++;       /* Direct bget() call count */
#endif
                buf =  (void *) (bdh + 1);
                KMP_DEBUG_ASSERT( ((size_t)buf) % SizeQuant == 0 );
                return buf;
            }

        } else {

            /*  Try to obtain a new expansion block */

            void *newpool;

            KE_TRACE( 10, ("%%%%%% MALLOCB( %d )\n", (int) thr->exp_incr ) );

            /* richryan */
            newpool = (*thr->acqfcn)((bufsize) thr->exp_incr);
            KMP_DEBUG_ASSERT( ((size_t)newpool) % SizeQuant == 0 );
            if (newpool != NULL) {
                bpool( th, newpool, thr->exp_incr);
                buf =  bget( th, requested_size);  /* This can't, I say, can't get into a loop. */
                return buf;
            }
        }
    }

    /*  Still no buffer available */

    return NULL;
}